

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_action.cpp
# Opt level: O1

bool __thiscall cppnet::EpollEventActions::DelEvent(EpollEventActions *this,Event *event)

{
  int iVar1;
  element_type *peVar2;
  int iVar3;
  SingletonLogger *pSVar4;
  uint *puVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar6;
  
  this_00 = (event->_socket).super___weak_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar3 = this_00->_M_use_count;
    do {
      if (iVar3 == 0) {
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar1 = this_00->_M_use_count;
      bVar6 = iVar3 == iVar1;
      if (bVar6) {
        this_00->_M_use_count = iVar3 + 1;
        iVar1 = iVar3;
      }
      iVar3 = iVar1;
      UNLOCK();
    } while (!bVar6);
  }
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar6 = true;
  }
  else {
    bVar6 = this_00->_M_use_count == 0;
  }
  peVar2 = (event->_socket).super___weak_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((bool)(peVar2 == (element_type *)0x0 | bVar6)) {
    bVar6 = false;
  }
  else {
    iVar3 = epoll_ctl(this->_epoll_handler,2,(int)peVar2->_sock,(epoll_event *)event->_data);
    if (iVar3 < 0) {
      pSVar4 = Singleton<cppnet::SingletonLogger>::Instance();
      puVar5 = (uint *)__errno_location();
      bVar6 = false;
      SingletonLogger::Error
                (pSVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/event/epoll/epoll_action.cpp"
                 ,0x10a,"remove event from EPOLL failed! error :%d, socket : %d",(ulong)*puVar5,
                 peVar2->_sock);
    }
    else {
      event->_event_type = 0;
      pSVar4 = Singleton<cppnet::SingletonLogger>::Instance();
      bVar6 = true;
      SingletonLogger::Debug
                (pSVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/event/epoll/epoll_action.cpp"
                 ,0x10f,"remove a socket from EPOLL, %d",peVar2->_sock);
    }
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return bVar6;
}

Assistant:

bool EpollEventActions::DelEvent(Event* event) {
    auto sock = event->GetSocket();
    if (!sock) {
        return false;
    }
    epoll_event* ev = (epoll_event*)event->GetData();
    int32_t ret = epoll_ctl(_epoll_handler, EPOLL_CTL_DEL, sock->GetSocket(), ev);
    if (ret < 0) {
        LOG_ERROR("remove event from EPOLL failed! error :%d, socket : %d", errno, sock->GetSocket());
        return false;
    }

    event->ClearType();
    LOG_DEBUG("remove a socket from EPOLL, %d", sock->GetSocket());
    return true;
}